

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O1

HRESULT __thiscall
utf8::NarrowStringToWideNoAlloc
          (utf8 *this,LPCSTR sourceString,size_t sourceCount,LPWSTR destString,
          size_t destBufferCount,charcount_t *destCount)

{
  utf8 uVar1;
  charcount_t cVar2;
  utf8char_t *dest;
  size_t sVar3;
  HMODULE pVVar4;
  uint uVar5;
  undefined8 *puVar6;
  ulong extraout_RDX;
  utf8 *source;
  utf8 *buffer;
  utf8char_t *lpLibFileName;
  size_t *psVar7;
  HRESULT HVar8;
  LPCSTR pCVar9;
  ulong cbDest;
  bool bVar10;
  
  HVar8 = -0x7ff8fff2;
  if (sourceString < (LPCSTR)0xffffffff) {
    if (sourceCount == 0) {
      return -0x7ff8ffa9;
    }
    HVar8 = -0x7ff8ffa9;
    if (sourceString < destString) {
      pCVar9 = (LPCSTR)0x0;
      if (sourceString != (LPCSTR)0x0) {
        do {
          uVar1 = this[(long)pCVar9];
          if ((char)uVar1 < '\x01') {
            bVar10 = pCVar9 < (LPCSTR)0x3;
            pCVar9 = pCVar9 + -3;
            if (bVar10) {
              pCVar9 = (LPCSTR)0x0;
            }
          }
          else {
            *(short *)(sourceCount + (long)pCVar9 * 2) = (short)(char)uVar1;
          }
        } while (('\0' < (char)uVar1) && (pCVar9 = pCVar9 + 1, pCVar9 < sourceString));
      }
      if ((long)sourceString - (long)pCVar9 == 0) {
        *(int *)destBufferCount = (int)sourceString;
        *(undefined2 *)(sourceCount + (long)sourceString * 2) = 0;
        source = (utf8 *)0x0;
        buffer = this;
        psVar7 = (size_t *)destBufferCount;
      }
      else {
        source = this + (long)pCVar9;
        cVar2 = ByteIndexIntoCharacterIndex
                          ((LPCUTF8)source,(long)sourceString - (long)pCVar9,doDefault);
        uVar5 = cVar2 + (int)pCVar9;
        if (sourceString < (LPCSTR)(ulong)uVar5) {
          return -0x7ff8fff2;
        }
        buffer = (utf8 *)(sourceCount + (long)pCVar9 * 2);
        psVar7 = (size_t *)0x0;
        DecodeUnitsIntoAndNullTerminateNoAdvance
                  ((char16 *)buffer,(LPCUTF8)source,(LPCUTF8)(this + (long)sourceString),
                   doAllowInvalidWCHARs,(bool *)0x0);
        *(uint *)destBufferCount = uVar5;
      }
      puVar6 = (undefined8 *)(ulong)*(uint *)destBufferCount;
      if (*(short *)(sourceCount + (long)puVar6 * 2) == 0) {
        return 0;
      }
      NarrowStringToWideNoAlloc();
      HVar8 = -0x7ff8fff2;
      if (((extraout_RDX < 0xffffffff) && (cbDest = extraout_RDX * 3 + 1, extraout_RDX <= cbDest))
         && (dest = (utf8char_t *)(*(code *)buffer)(cbDest), dest != (utf8char_t *)0x0)) {
        lpLibFileName = dest;
        sVar3 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                          (dest,cbDest,(char16 *)source,(charcount_t)extraout_RDX);
        if (cbDest < sVar3) {
          WideStringToNarrow<void*(*)(unsigned_long)>();
          pVVar4 = LoadLibraryExA((LPCSTR)lpLibFileName,(HANDLE)0x0,0);
          return (HRESULT)pVVar4;
        }
        *puVar6 = dest;
        *psVar7 = sVar3;
        HVar8 = 0;
        if ((size_t *)destCount != (size_t *)0x0) {
          *(size_t *)destCount = sVar3;
          HVar8 = 0;
        }
      }
      return HVar8;
    }
  }
  *(undefined2 *)sourceCount = 0;
  return HVar8;
}

Assistant:

inline HRESULT NarrowStringToWideNoAlloc(_In_ LPCSTR sourceString, size_t sourceCount,
        __out_ecount(destBufferCount) LPWSTR destString, size_t destBufferCount, _Out_ charcount_t* destCount)
    {
        size_t sourceStart = 0;
        size_t cbSourceString = sourceCount;

        if (sourceCount >= MAXUINT32)
        {
            destString[0] = WCHAR(0);
            return E_OUTOFMEMORY;
        }

        if (destString == nullptr)
        {
            return E_INVALIDARG;
        }

        if (sourceCount >= destBufferCount)
        {
            destString[0] = WCHAR(0);
            return E_INVALIDARG;
        }

        for (; sourceStart < sourceCount; sourceStart++)
        {
            const char ch = sourceString[sourceStart];
            if ( ! (ch > 0 && ch < 0x0080) )
            {
                size_t fallback = sourceStart > 3 ? 3 : sourceStart; // 3 + 1 -> fallback at least 1 unicode char
                sourceStart -= fallback;
                break;
            }
            destString[sourceStart] = (WCHAR) ch;
        }

        if (sourceStart == sourceCount)
        {
            *destCount = static_cast<charcount_t>(sourceCount);
            destString[sourceCount] = WCHAR(0);
        }
        else
        {
            LPCUTF8 remSourceString = (LPCUTF8)sourceString + sourceStart;
            WCHAR *remDestString = destString + sourceStart;

            charcount_t cchDestString = utf8::ByteIndexIntoCharacterIndex(remSourceString, cbSourceString - sourceStart);
            cchDestString += (charcount_t)sourceStart;
            if (cchDestString > sourceCount)
            {
                return E_OUTOFMEMORY;
            }

            // Some node tests depend on the utf8 decoder not swallowing invalid unicode characters
            // instead of replacing them with the "replacement" chracter. Pass a flag to our
            // decoder to require such behavior
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(remDestString, remSourceString, (LPCUTF8) sourceString + cbSourceString, DecodeOptions::doAllowInvalidWCHARs);

            static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
            *destCount = cchDestString;
        }

        Assert(destString[*destCount] == 0);

        return S_OK;
    }